

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexDecomposition.cpp
# Opt level: O1

void ConvexDecomposition::addTri
               (VertexLookup vl,UintVector *list,Vector3d *p1,Vector3d *p2,Vector3d *p3)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  uVar2 = Vl_getIndex(vl,&p1->x);
  uVar3 = Vl_getIndex(vl,&p2->x);
  uVar4 = Vl_getIndex(vl,&p3->x);
  if (((uVar3 != uVar4) && (uVar2 != uVar3)) && (uVar2 != uVar4)) {
    iVar6 = list->m_size;
    if (iVar6 == list->m_capacity) {
      iVar8 = 1;
      if (iVar6 != 0) {
        iVar8 = iVar6 * 2;
      }
      if (list->m_capacity < iVar8) {
        if (iVar8 == 0) {
          puVar5 = (uint *)0x0;
        }
        else {
          puVar5 = (uint *)cbtAlignedAllocInternal((long)iVar8 << 2,0x10);
        }
        iVar6 = list->m_size;
        if (0 < (long)iVar6) {
          puVar1 = list->m_data;
          lVar7 = 0;
          do {
            puVar5[lVar7] = puVar1[lVar7];
            lVar7 = lVar7 + 1;
          } while (iVar6 != lVar7);
        }
        if (list->m_data != (uint *)0x0) {
          if (list->m_ownsMemory == true) {
            cbtAlignedFreeInternal(list->m_data);
          }
          list->m_data = (uint *)0x0;
        }
        list->m_ownsMemory = true;
        list->m_data = puVar5;
        list->m_capacity = iVar8;
      }
    }
    list->m_data[list->m_size] = uVar2;
    iVar6 = list->m_size + 1;
    list->m_size = iVar6;
    if (iVar6 == list->m_capacity) {
      iVar8 = 1;
      if (iVar6 != 0) {
        iVar8 = iVar6 * 2;
      }
      if (list->m_capacity < iVar8) {
        if (iVar8 == 0) {
          puVar5 = (uint *)0x0;
        }
        else {
          puVar5 = (uint *)cbtAlignedAllocInternal((long)iVar8 << 2,0x10);
        }
        iVar6 = list->m_size;
        if (0 < (long)iVar6) {
          puVar1 = list->m_data;
          lVar7 = 0;
          do {
            puVar5[lVar7] = puVar1[lVar7];
            lVar7 = lVar7 + 1;
          } while (iVar6 != lVar7);
        }
        if (list->m_data != (uint *)0x0) {
          if (list->m_ownsMemory == true) {
            cbtAlignedFreeInternal(list->m_data);
          }
          list->m_data = (uint *)0x0;
        }
        list->m_ownsMemory = true;
        list->m_data = puVar5;
        list->m_capacity = iVar8;
      }
    }
    list->m_data[list->m_size] = uVar3;
    iVar6 = list->m_size + 1;
    list->m_size = iVar6;
    if (iVar6 == list->m_capacity) {
      iVar8 = 1;
      if (iVar6 != 0) {
        iVar8 = iVar6 * 2;
      }
      if (list->m_capacity < iVar8) {
        if (iVar8 == 0) {
          puVar5 = (uint *)0x0;
        }
        else {
          puVar5 = (uint *)cbtAlignedAllocInternal((long)iVar8 << 2,0x10);
        }
        iVar6 = list->m_size;
        if (0 < (long)iVar6) {
          puVar1 = list->m_data;
          lVar7 = 0;
          do {
            puVar5[lVar7] = puVar1[lVar7];
            lVar7 = lVar7 + 1;
          } while (iVar6 != lVar7);
        }
        if (list->m_data != (uint *)0x0) {
          if (list->m_ownsMemory == true) {
            cbtAlignedFreeInternal(list->m_data);
          }
          list->m_data = (uint *)0x0;
        }
        list->m_ownsMemory = true;
        list->m_data = puVar5;
        list->m_capacity = iVar8;
      }
    }
    list->m_data[list->m_size] = uVar4;
    list->m_size = list->m_size + 1;
  }
  return;
}

Assistant:

void addTri(VertexLookup vl,UintVector &list,const Vector3d &p1,const Vector3d &p2,const Vector3d &p3)
{
  unsigned int i1 = Vl_getIndex(vl, p1.Ptr() );
  unsigned int i2 = Vl_getIndex(vl, p2.Ptr() );
  unsigned int i3 = Vl_getIndex(vl, p3.Ptr() );

  // do *not* process degenerate triangles!

  if ( i1 != i2 && i1 != i3 && i2 != i3 )
  {
    list.push_back(i1);
    list.push_back(i2);
    list.push_back(i3);
  }
}